

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt * __thiscall slang::SVInt::operator^=(SVInt *this,SVInt *rhs)

{
  uint64_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  byte local_71;
  uint local_64;
  uint local_60;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t words;
  SVInt local_48;
  SVInt local_38;
  byte local_21;
  SVInt *pSStack_20;
  bool bothSigned;
  SVInt *rhs_local;
  SVInt *this_local;
  
  pSStack_20 = rhs;
  rhs_local = this;
  if ((this->super_SVIntStorage).bitWidth != (rhs->super_SVIntStorage).bitWidth) {
    local_71 = 0;
    if (((this->super_SVIntStorage).signFlag & 1U) != 0) {
      local_71 = (rhs->super_SVIntStorage).signFlag;
    }
    local_21 = local_71 & 1;
    if ((rhs->super_SVIntStorage).bitWidth <= (this->super_SVIntStorage).bitWidth) {
      extend(&local_48,(bitwidth_t)rhs,SUB41((this->super_SVIntStorage).bitWidth,0));
      this_local = operator^=(this,&local_48);
      ~SVInt(&local_48);
      return this_local;
    }
    extend(&local_38,(bitwidth_t)this,SUB41((rhs->super_SVIntStorage).bitWidth,0));
    operator=(this,&local_38);
    ~SVInt(&local_38);
  }
  bVar2 = hasUnknown(this);
  if ((!bVar2) && (bVar2 = hasUnknown(pSStack_20), bVar2)) {
    makeUnknown(this);
  }
  bVar2 = isSingleWord(this);
  if (bVar2) {
    (this->super_SVIntStorage).field_0.val =
         (pSStack_20->super_SVIntStorage).field_0.val ^ (this->super_SVIntStorage).field_0.val;
  }
  else {
    uVar3 = getNumWords((this->super_SVIntStorage).bitWidth,false);
    if (((this->super_SVIntStorage).unknownFlag & 1U) == 0) {
      for (local_64 = 0; local_64 < uVar3; local_64 = local_64 + 1) {
        puVar1 = (this->super_SVIntStorage).field_0.pVal;
        puVar1[local_64] =
             (pSStack_20->super_SVIntStorage).field_0.pVal[local_64] ^ puVar1[local_64];
      }
    }
    else {
      bVar2 = isSingleWord(pSStack_20);
      if (bVar2) {
        *(this->super_SVIntStorage).field_0.pVal =
             (*(ulong *)((this->super_SVIntStorage).field_0.val + 8) ^ 0xffffffffffffffff) &
             (*(this->super_SVIntStorage).field_0.pVal ^
             (pSStack_20->super_SVIntStorage).field_0.val);
      }
      else {
        bVar2 = hasUnknown(pSStack_20);
        if (bVar2) {
          for (i_2 = 0; i_2 < uVar3; i_2 = i_2 + 1) {
            puVar1 = (this->super_SVIntStorage).field_0.pVal;
            puVar1[i_2 + uVar3] =
                 (pSStack_20->super_SVIntStorage).field_0.pVal[i_2 + uVar3] | puVar1[i_2 + uVar3];
          }
        }
        for (local_60 = 0; local_60 < uVar3; local_60 = local_60 + 1) {
          (this->super_SVIntStorage).field_0.pVal[local_60] =
               ((this->super_SVIntStorage).field_0.pVal[local_60 + uVar3] ^ 0xffffffffffffffff) &
               ((this->super_SVIntStorage).field_0.pVal[local_60] ^
               (pSStack_20->super_SVIntStorage).field_0.pVal[local_60]);
        }
      }
    }
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator^=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this ^= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val ^= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord())
                pVal[0] = ~pVal[1] & (pVal[0] ^ rhs.val);
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] |= rhs.pVal[i + words];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] ^ rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] ^= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    return *this;
}